

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  long lVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  undefined4 in_register_00000034;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong in_XMM0_Qb;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  uint in_XMM1_Db;
  uint in_XMM1_Dd;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Float uc;
  ulong in_XMM2_Qb;
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined1 auVar25 [16];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wo_13;
  Vector3f wo_14;
  Vector3f wo_15;
  Vector3f wo_16;
  Vector3f wo_17;
  Vector3f wo_18;
  Vector3f wo_19;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  Vector3f wi_07;
  Vector3f wi_08;
  Vector3f wi_09;
  Vector3f wi_10;
  Vector3f wi_11;
  BSDFSample wos;
  BSDFSample wis;
  float local_ec;
  Tuple2<pbrt::Point2,_float> local_e8;
  float local_dc;
  ConductorBxDF *local_d8;
  TransportMode local_cc;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  float local_a8;
  uint uStack_a4;
  undefined4 uStack_a0;
  uint uStack_9c;
  float local_98;
  uint uStack_94;
  undefined4 uStack_90;
  uint uStack_8c;
  float local_7c;
  BSDFSample local_78;
  BSDFSample local_54;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  uStack_90 = 0;
  uStack_a0 = 0;
  local_98 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_c8 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_a8 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_b8 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x41e,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  uStack_c0 = in_XMM2_Qb;
  uStack_b0 = in_XMM0_Qb;
  if (((this->config).twoSided != '\0') && (local_a8 < 0.0)) {
    local_a8 = -local_a8;
    in_XMM1_Db = in_XMM1_Db ^ 0x80000000;
    uStack_a0 = 0x80000000;
    in_XMM1_Dd = in_XMM1_Dd ^ 0x80000000;
    local_98 = -local_98;
    in_XMM3_Db = in_XMM3_Db ^ 0x80000000;
    uStack_90 = 0x80000000;
    in_XMM3_Dd = in_XMM3_Dd ^ 0x80000000;
    local_b8 = local_b8 ^ 0x8000000080000000;
    uStack_b0 = in_XMM0_Qb ^ 0x8000000080000000;
    local_c8 = local_c8 ^ 0x8000000080000000;
    uStack_c0 = in_XMM2_Qb ^ 0x8000000080000000;
  }
  local_7c = local_98 * local_a8;
  local_ec = 0.0;
  uVar13 = *(uint *)(Options + 4);
  uStack_a4 = in_XMM1_Db;
  uStack_9c = in_XMM1_Dd;
  uStack_94 = in_XMM3_Db;
  uStack_8c = in_XMM3_Dd;
  if (0.0 < local_7c) {
    bVar2 = (this->config).nSamples;
    if (local_a8 <= 0.0) {
      in_register_00000034 = 0;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
      auVar22._0_4_ = ConductorBxDF::PDF(&this->bottom,wo_01,wi_01,mode,Reflection);
      auVar22._4_60_ = extraout_var_00;
      auVar18 = auVar22._0_16_;
    }
    else {
      in_register_00000034 = 0;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
      auVar21._0_4_ = DielectricInterfaceBxDF::PDF(&this->top,wo_00,wi_00,mode,Reflection);
      auVar21._4_60_ = extraout_var;
      auVar18 = auVar21._0_16_;
    }
    auVar18 = vfmadd213ss_fma(auVar18,ZEXT416((uint)(float)bVar2),ZEXT416(0));
    local_ec = auVar18._0_4_;
  }
  fVar16 = 0.0;
  if ((this->config).nSamples != '\0') {
    uVar10 = (CONCAT44(in_register_00000034,local_a8) ^
             ((local_b8 * -0x395b586ca42e166b >> 0x2f ^ local_b8 * -0x395b586ca42e166b) *
              -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b
    ;
    uVar12 = (uVar10 >> 0x2f ^ uVar10) * -0x395b586ca42e166b;
    uVar10 = (CONCAT44(0x4fb7dae8,local_98) ^
             ((local_c8 * -0x395b586ca42e166b >> 0x2f ^ local_c8 * -0x395b586ca42e166b) *
              -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b
    ;
    uVar11 = (uVar13 & 0xffffff ^ uVar12 ^ 0x1a929e4d6f47a654 ^
             (uVar12 >> 0x2f | (ulong)(uVar13 & 0xff000000))) * -0x395b586ca42e166b;
    uVar12 = (uVar10 >> 0x2f ^ uVar10) * -0x395b586ca42e166b;
    uVar10 = (uVar11 >> 0x2f ^ uVar11) * -0x395b586ca42e166b;
    uVar10 = uVar10 >> 0x2f ^ uVar10;
    lVar1 = uVar10 * 2 + 1;
    uVar10 = ((uVar12 >> 0x2f ^ uVar12) + 1) * 0x5851f42d4c957f2d + uVar10 * -0x4f5c17a566d501a4 + 1
    ;
    local_d8 = &this->bottom;
    uVar13 = 0;
    local_cc = (TransportMode)(mode == Radiance);
    do {
      uVar9 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar2 = (byte)(uVar10 >> 0x3b);
      uVar12 = uVar10 * 0x5851f42d4c957f2d + lVar1;
      uVar11 = uVar12 * 0x5851f42d4c957f2d + lVar1;
      uVar10 = uVar11 * 0x5851f42d4c957f2d + lVar1;
      auVar18._4_12_ = in_register_00001384;
      auVar18._0_4_ = in_XMM6_Da;
      auVar3 = vcvtusi2ss_avx512f(auVar18,uVar9 >> bVar2 | uVar9 << 0x20 - bVar2);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar12;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar11;
      auVar18 = vpunpcklqdq_avx(auVar17,auVar23);
      auVar15 = vpsrlvq_avx2(auVar18,_DAT_004a5510);
      auVar17 = vpsrlvq_avx2(auVar18,_DAT_004a5520);
      auVar18 = vpsrlq_avx(auVar18,0x3b);
      auVar14 = vpshufd_avx(auVar18,0xe8);
      auVar18 = vminss_avx(ZEXT416((uint)(auVar3._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      auVar15 = vpshufd_avx(auVar15 ^ auVar17,0xe8);
      auVar14 = vprorvd_avx512vl(auVar15,auVar14);
      auVar15 = vcvtudq2ps_avx512vl(auVar14);
      auVar14._8_4_ = 0x2f800000;
      auVar14._0_8_ = 0x2f8000002f800000;
      auVar14._12_4_ = 0x2f800000;
      auVar14 = vmulps_avx512vl(auVar15,auVar14);
      auVar15._8_4_ = 0x3f7fffff;
      auVar15._0_8_ = 0x3f7fffff3f7fffff;
      auVar15._12_4_ = 0x3f7fffff;
      auVar14 = vminps_avx512vl(auVar14,auVar15);
      uc = auVar18._0_4_;
      bVar2 = (byte)(uVar10 >> 0x38);
      uVar9 = (uint)(uVar10 >> 0x20);
      if (local_7c <= 0.0) {
        local_e8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar14);
        if (local_a8 <= 0.0) {
          wo_07.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
          wo_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
          wo_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
          ConductorBxDF::Sample_f(&local_78,local_d8,wo_07,uc,(Point2f *)&local_e8,mode,All);
        }
        else {
          wo_03.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
          wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
          wo_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
          DielectricInterfaceBxDF::Sample_f
                    (&local_78,&this->top,wo_03,uc,(Point2f *)&local_e8,mode,All);
        }
        if ((local_78.pdf <= 0.0) ||
           (((local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
             (!NAN(local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z))) ||
            (((undefined1)local_78.flags & Reflection) != Unset)))) goto LAB_0040ed37;
        uVar9 = uVar9 >> 0xd ^ (uint)(uVar10 >> 0x1b);
        bVar2 = bVar2 >> 3;
        uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
        auVar8._4_12_ = in_register_00001384;
        auVar8._0_4_ = in_XMM6_Da;
        auVar18 = vcvtusi2ss_avx512f(auVar8,uVar9 >> bVar2 | uVar9 << 0x20 - bVar2);
        uVar12 = uVar10 * 0x5851f42d4c957f2d + lVar1;
        auVar18 = vminss_avx(ZEXT416((uint)(auVar18._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar10;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar12;
        auVar14 = vpunpcklqdq_avx(auVar20,auVar25);
        auVar15 = vpsrlvq_avx2(auVar14,_DAT_004a5510);
        auVar17 = vpsrlvq_avx2(auVar14,_DAT_004a5520);
        auVar14 = vpsrlq_avx(auVar14,0x3b);
        auVar14 = vpshufd_avx(auVar14,0xe8);
        auVar15 = vpshufd_avx(auVar15 ^ auVar17,0xe8);
        auVar14 = vprorvd_avx512vl(auVar15,auVar14);
        auVar14 = vcvtudq2ps_avx512vl(auVar14);
        auVar3._8_4_ = 0x2f800000;
        auVar3._0_8_ = 0x2f8000002f800000;
        auVar3._12_4_ = 0x2f800000;
        auVar14 = vmulps_avx512vl(auVar14,auVar3);
        auVar6._8_4_ = 0x3f7fffff;
        auVar6._0_8_ = 0x3f7fffff3f7fffff;
        auVar6._12_4_ = 0x3f7fffff;
        auVar14 = vminps_avx512vl(auVar14,auVar6);
        local_e8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar14);
        if (local_a8 <= 0.0) {
          wo_12.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
          wo_12.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
          wo_12.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
          DielectricInterfaceBxDF::Sample_f
                    (&local_54,&this->top,wo_12,auVar18._0_4_,(Point2f *)&local_e8,local_cc,All);
        }
        else {
          wo_08.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
          wo_08.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
          wo_08.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
          ConductorBxDF::Sample_f
                    (&local_54,local_d8,wo_08,auVar18._0_4_,(Point2f *)&local_e8,local_cc,All);
        }
        if (((local_54.pdf <= 0.0) ||
            ((local_54.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
             (!NAN(local_54.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) ||
           (((undefined1)local_54.flags & Reflection) != Unset)) goto LAB_0040ed30;
        if (local_a8 <= 0.0) {
          auVar18 = vminss_avx(ZEXT416((uint)(this->bottom).mfDistrib.alpha_y),
                               ZEXT416((uint)(this->bottom).mfDistrib.alpha_x));
          if (0.001 <= auVar18._0_4_) {
            auVar18 = vminss_avx(ZEXT416((uint)(this->top).mfDistrib.alpha_y),
                                 ZEXT416((uint)(this->top).mfDistrib.alpha_x));
            local_dc = auVar18._0_4_;
            wi_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                 local_54.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
            wi_08.super_Tuple3<pbrt::Vector3,_float>.z =
                 -local_54.wi.super_Tuple3<pbrt::Vector3,_float>.z;
            wo_16.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
            wo_16.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
            wo_16.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
            fVar16 = ConductorBxDF::PDF(local_d8,wo_16,wi_08,mode,All);
            goto LAB_0040ec62;
          }
LAB_0040ebd2:
          wo_15.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
               local_78.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
          wo_15.super_Tuple3<pbrt::Vector3,_float>.z =
               -local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          if (local_a8 <= 0.0) {
            wo_18.super_Tuple3<pbrt::Vector3,_float>.z = wo_15.super_Tuple3<pbrt::Vector3,_float>.z;
            wo_18.super_Tuple3<pbrt::Vector3,_float>.x =
                 (float)(int)wo_15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            wo_18.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)(wo_15.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
            wi_10.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
            wi_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
            wi_10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
            fVar16 = DielectricInterfaceBxDF::PDF(&this->top,wo_18,wi_10,mode,All);
          }
          else {
            wi_07.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
            wi_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
            wi_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
            fVar16 = ConductorBxDF::PDF(local_d8,wo_15,wi_07,mode,All);
          }
        }
        else {
          auVar18 = vminss_avx(ZEXT416((uint)(this->top).mfDistrib.alpha_y),
                               ZEXT416((uint)(this->top).mfDistrib.alpha_x));
          if (auVar18._0_4_ < 0.001) goto LAB_0040ebd2;
          auVar18 = vminss_avx(ZEXT416((uint)(this->bottom).mfDistrib.alpha_y),
                               ZEXT416((uint)(this->bottom).mfDistrib.alpha_x));
          local_dc = auVar18._0_4_;
          wi_05.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
               local_54.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
          wi_05.super_Tuple3<pbrt::Vector3,_float>.z =
               -local_54.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          wo_13.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
          wo_13.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
          wo_13.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
          fVar16 = DielectricInterfaceBxDF::PDF(&this->top,wo_13,wi_05,mode,All);
LAB_0040ec62:
          if (0.001 <= local_dc) {
            wo_17.super_Tuple3<pbrt::Vector3,_float>.z =
                 -local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
            wo_17.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                 local_78.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
            local_dc = fVar16;
            if (local_a8 <= 0.0) {
              wo_19.super_Tuple3<pbrt::Vector3,_float>.z =
                   wo_17.super_Tuple3<pbrt::Vector3,_float>.z;
              wo_19.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)(int)wo_17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              wo_19.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)(int)(wo_17.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
              wi_11.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
              wi_11.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
              wi_11.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
              fVar16 = DielectricInterfaceBxDF::PDF(&this->top,wo_19,wi_11,mode,All);
            }
            else {
              wi_09.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
              wi_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
              wi_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
              fVar16 = ConductorBxDF::PDF(local_d8,wo_17,wi_09,mode,All);
            }
            fVar16 = (fVar16 + local_dc) * 0.5;
          }
        }
        local_ec = local_ec + fVar16;
LAB_0040ed30:
        uVar10 = uVar12 * 0x5851f42d4c957f2d + lVar1;
      }
      else {
        local_e8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar14);
        if (local_a8 <= 0.0) {
          wo_04.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
          wo_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
          wo_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
          ConductorBxDF::Sample_f(&local_78,local_d8,wo_04,uc,(Point2f *)&local_e8,mode,All);
        }
        else {
          wo_02.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
          wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
          wo_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
          DielectricInterfaceBxDF::Sample_f
                    (&local_78,&this->top,wo_02,uc,(Point2f *)&local_e8,mode,All);
        }
        if (((0.0 < local_78.pdf) &&
            ((local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
             (NAN(local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) &&
           (((undefined1)local_78.flags & Reflection) == Unset)) {
          uVar9 = uVar9 >> 0xd ^ (uint)(uVar10 >> 0x1b);
          bVar2 = bVar2 >> 3;
          uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
          uVar12 = uVar10 * 0x5851f42d4c957f2d + lVar1;
          auVar7._4_12_ = in_register_00001384;
          auVar7._0_4_ = in_XMM6_Da;
          auVar18 = vcvtusi2ss_avx512f(auVar7,uVar9 >> bVar2 | uVar9 << 0x20 - bVar2);
          auVar18 = vminss_avx(ZEXT416((uint)(auVar18._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar10;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar12;
          auVar14 = vpunpcklqdq_avx(auVar19,auVar24);
          auVar15 = vpsrlvq_avx2(auVar14,_DAT_004a5510);
          auVar17 = vpsrlvq_avx2(auVar14,_DAT_004a5520);
          auVar14 = vpsrlq_avx(auVar14,0x3b);
          auVar14 = vpshufd_avx(auVar14,0xe8);
          auVar15 = vpshufd_avx(auVar15 ^ auVar17,0xe8);
          auVar14 = vprorvd_avx512vl(auVar15,auVar14);
          auVar14 = vcvtudq2ps_avx512vl(auVar14);
          auVar4._8_4_ = 0x2f800000;
          auVar4._0_8_ = 0x2f8000002f800000;
          auVar4._12_4_ = 0x2f800000;
          auVar14 = vmulps_avx512vl(auVar14,auVar4);
          auVar5._8_4_ = 0x3f7fffff;
          auVar5._0_8_ = 0x3f7fffff3f7fffff;
          auVar5._12_4_ = 0x3f7fffff;
          auVar14 = vminps_avx512vl(auVar14,auVar5);
          local_e8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar14);
          if (local_a8 <= 0.0) {
            wo_10.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
            wo_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
            wo_10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
            ConductorBxDF::Sample_f
                      (&local_54,local_d8,wo_10,auVar18._0_4_,(Point2f *)&local_e8,local_cc,All);
          }
          else {
            wo_05.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
            wo_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
            wo_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
            DielectricInterfaceBxDF::Sample_f
                      (&local_54,&this->top,wo_05,auVar18._0_4_,(Point2f *)&local_e8,local_cc,All);
          }
          if ((0.0 < local_54.pdf) &&
             (((local_54.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
               (NAN(local_54.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
              (((undefined1)local_54.flags & Reflection) == Unset)))) {
            wo_11.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                 local_78.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
            wo_11.super_Tuple3<pbrt::Vector3,_float>.z =
                 -local_78.wi.super_Tuple3<pbrt::Vector3,_float>.z;
            wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                 local_54.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
            wi_04.super_Tuple3<pbrt::Vector3,_float>.z =
                 -local_54.wi.super_Tuple3<pbrt::Vector3,_float>.z;
            if (local_a8 <= 0.0) {
              wo_14.super_Tuple3<pbrt::Vector3,_float>.z =
                   wo_11.super_Tuple3<pbrt::Vector3,_float>.z;
              wo_14.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)(int)wo_11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              wo_14.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)(int)(wo_11.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
              wi_06.super_Tuple3<pbrt::Vector3,_float>.z =
                   wi_04.super_Tuple3<pbrt::Vector3,_float>.z;
              wi_06.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)(int)wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              wi_06.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)(int)(wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
              fVar16 = DielectricInterfaceBxDF::PDF(&this->top,wo_14,wi_06,mode,All);
            }
            else {
              fVar16 = ConductorBxDF::PDF(local_d8,wo_11,wi_04,mode,All);
            }
            local_ec = local_ec + fVar16;
          }
          goto LAB_0040ed30;
        }
        if (local_a8 <= 0.0) {
          wo_09.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
          wo_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
          wo_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
          wi_03.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
          wi_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
          wi_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
          fVar16 = ConductorBxDF::PDF(local_d8,wo_09,wi_03,mode,All);
        }
        else {
          wo_06.super_Tuple3<pbrt::Vector3,_float>.z = local_a8;
          wo_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_b8;
          wo_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_b8._4_4_;
          wi_02.super_Tuple3<pbrt::Vector3,_float>.z = local_98;
          wi_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
          wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
          fVar16 = DielectricInterfaceBxDF::PDF(&this->top,wo_06,wi_02,mode,All);
        }
        local_ec = local_ec + fVar16;
      }
LAB_0040ed37:
      bVar2 = (this->config).nSamples;
      uVar13 = uVar13 + 1;
    } while (uVar13 < bVar2);
    fVar16 = (float)bVar2;
  }
  return (local_ec / fVar16) * 0.9 + 0.007957749;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        // Update _pdfSum_ for reflection at the entrance layer
        if (SameHemisphere(wo, wi)) {
            if (enteredTop)
                pdfSum += config.nSamples *
                          top.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
            else
                pdfSum += config.nSamples *
                          bottom.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = tInterface.Sample_f(wo, uc, u, mode);

                // Update _pdfSum_ accounting for TRT scattering events
                if (!wos || wos.wi.z == 0 || wos.IsReflection()) {
                    pdfSum += tInterface.PDF(wo, wi, mode);
                } else {
                    uc = r();
                    u = Point2f(r(), r());
                    BSDFSample wis = tInterface.Sample_f(wi, uc, u, ~mode);
                    if (!wis || wis.wi.z == 0 || wis.IsReflection())
                        continue;
                    // if (IsSpecular(tInterface.Flags()))
                    pdfSum += rInterface.PDF(-wos.wi, -wis.wi, mode);
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || wos.wi.z == 0 || wos.IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                BSDFSample wis = tiInterface.Sample_f(wi, uc, u, ~mode);
                if (!wis || wis.wi.z == 0 || wis.IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos.wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis.wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis.wi, mode) +
                               tiInterface.PDF(-wos.wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(.9, 1 / (4 * Pi), pdfSum / config.nSamples);
    }